

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arguments.c
# Opt level: O3

void parse_arguments(Arguments *arguments,int argc,char **argv)

{
  int iVar1;
  Arguments *pAVar2;
  int long_index;
  undefined4 local_3c;
  Arguments *local_38;
  
  local_3c = 0;
  _optind = 0;
  arguments->size = 0x1000;
  arguments->count = 1000;
  local_38 = (Arguments *)&arguments->count;
  do {
    while ((iVar1 = getopt_long(argc,argv,"+:s:c:",parse_arguments::long_options,&local_3c),
           pAVar2 = local_38, iVar1 == 99 || (pAVar2 = arguments, iVar1 == 0x73))) {
      iVar1 = atoi(_optarg);
      pAVar2->size = iVar1;
    }
  } while (iVar1 != -1);
  return;
}

Assistant:

void parse_arguments(Arguments *arguments, int argc, char *argv[]) {
	// For getopt long options
	int long_index = 0;
	// For getopt chars
	int option;

	// Reset the option index to 1 if it
	// was modified before (e.g. in check_flag)
	optind = 0;

	// Default values
	arguments->size = DEFAULT_MESSAGE_SIZE;
	arguments->count = 1000;

	// Command line arguments
	// clang-format off
	static struct option long_options[] = {
			{"size",  required_argument, NULL, 's'},
			{"count", required_argument, NULL, 'c'},
			{0,       0,                 0,     0}
	};
	// clang-format on

	while (true) {
		option = getopt_long(argc, argv, "+:s:c:", long_options, &long_index);

		switch (option) {
			case -1: return;
			case 's': arguments->size = atoi(optarg); break;
			case 'c': arguments->count = atoi(optarg); break;
			default: continue;
		}
	}
}